

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O0

bool __thiscall
r_comp::Class::get_member_index
          (Class *this,Metadata *metadata,string *name,uint16_t *index,Class **p)

{
  uint16_t uVar1;
  __type _Var2;
  bool bVar3;
  size_type sVar4;
  const_reference pvVar5;
  Class *pCVar6;
  ushort local_3a;
  uint16_t i;
  Class **p_local;
  uint16_t *index_local;
  string *name_local;
  Metadata *metadata_local;
  Class *this_local;
  
  local_3a = 0;
  while( true ) {
    sVar4 = std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::size
                      (&this->things_to_read);
    if (sVar4 <= local_3a) {
      return false;
    }
    pvVar5 = std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::
             operator[](&this->things_to_read,(ulong)local_3a);
    _Var2 = std::operator==(&pvVar5->name,name);
    if (_Var2) break;
    local_3a = local_3a + 1;
  }
  bVar3 = has_offset(this);
  uVar1 = local_3a;
  if (bVar3) {
    uVar1 = local_3a + 1;
  }
  *index = uVar1;
  pvVar5 = std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::
           operator[](&this->things_to_read,(ulong)local_3a);
  bVar3 = StructureMember::used_as_expression(pvVar5);
  if (bVar3) {
    *p = (Class *)0x0;
  }
  else {
    pvVar5 = std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::
             operator[](&this->things_to_read,(ulong)local_3a);
    pCVar6 = StructureMember::get_class(pvVar5,metadata);
    *p = pCVar6;
  }
  return true;
}

Assistant:

bool Class::get_member_index(Metadata *metadata, std::string &name, uint16_t &index, Class *&p) const
{
    for (uint16_t i = 0; i < things_to_read.size(); ++i)
        if (things_to_read[i].name == name) {
            index = (has_offset() ? i + 1 : i); // in expressions the lead r-atom is at 0; in objects, members start at 1

            if (things_to_read[i].used_as_expression()) { // the class is: [::a-class]
                p = nullptr;
            } else {
                p = things_to_read[i].get_class(metadata);
            }

            return true;
        }

    return false;
}